

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
__thiscall ninx::parser::Parser::parse_implicit_block_until(Parser *this,char end_limiter)

{
  TokenReader *this_00;
  undefined1 auVar1 [8];
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> _Var2;
  int iVar3;
  char in_DL;
  undefined7 in_register_00000031;
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  statements;
  undefined1 local_60 [8];
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  local_58;
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> local_40;
  _Head_base<0UL,_ninx::parser::element::Statement_*,_false> local_38;
  
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (TokenReader *)(CONCAT71(in_register_00000031,end_limiter) + 0x20);
  local_40._M_head_impl = (Block *)this;
  iVar3 = TokenReader::check_limiter(this_00,in_DL);
  if (iVar3 != 1) {
    local_60 = (undefined1  [8])0x0;
    do {
      parse_statement((Parser *)&stack0xffffffffffffffc8);
      auVar1 = local_60;
      local_60 = (undefined1  [8])local_38._M_head_impl;
      if ((_Tuple_impl<0UL,_ninx::parser::element::Statement_*,_std::default_delete<ninx::parser::element::Statement>_>
           )auVar1 != (Statement *)0x0) {
        (**(code **)(*(_func_int **)auVar1 + 8))();
      }
      if (local_60 == (undefined1  [8])0x0) goto LAB_0012166c;
      std::
      vector<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>,std::allocator<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>>
      ::
      emplace_back<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>
                ((vector<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>,std::allocator<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>>
                  *)&local_58,
                 (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
                  *)local_60);
      iVar3 = TokenReader::check_limiter(this_00,in_DL);
    } while (iVar3 < 1);
    if (local_60 != (undefined1  [8])0x0) {
      (*((ASTElement *)local_60)->_vptr_ASTElement[1])();
    }
  }
LAB_0012166c:
  std::
  make_unique<ninx::parser::element::Block,std::vector<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>,std::allocator<std::unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>>>>
            ((vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
              *)local_60);
  _Var2._M_head_impl = local_40._M_head_impl;
  ((local_40._M_head_impl)->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement =
       (_func_int **)local_60;
  std::
  vector<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>,_std::allocator<std::unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>_>_>
  ::~vector(&local_58);
  return (__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>,_true,_true>
            )_Var2._M_head_impl;
}

Assistant:

std::unique_ptr<Block> ninx::parser::Parser::parse_implicit_block_until(char end_limiter) {
    std::vector<std::unique_ptr<Statement>> statements;

    // Make sure this is not an empty block
    if (reader.check_limiter(end_limiter) != 1) {

        // Not empty, cycle to get all the statements
        std::unique_ptr<Statement> current;
        while ((current = parse_statement())) {
            if (current != nullptr) {
                statements.push_back(std::move(current));
            }

            // Check if the block will be closed
            if (reader.check_limiter(end_limiter) > 0) {
                // Exit the cycle, because the next token marks the end of a block
                break;
            }
        }
    }

    auto block = std::make_unique<Block>(std::move(statements));
    return std::move(block);
}